

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared_statement.cpp
# Opt level: O2

unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
__thiscall
duckdb::PreparedStatement::PendingQuery
          (PreparedStatement *this,vector<duckdb::Value,_true> *values,bool allow_stream_result)

{
  reference other;
  mapped_type *this_00;
  undefined7 in_register_00000011;
  vector<duckdb::Value,_true> *this_01;
  ulong __n;
  case_insensitive_map_t<BoundParameterData> named_values;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_120;
  string local_e8;
  Value local_c8;
  BoundParameterData local_88;
  
  this_01 = (vector<duckdb::Value,_true> *)CONCAT71(in_register_00000011,allow_stream_result);
  local_120._M_buckets = &local_120._M_single_bucket;
  local_120._M_bucket_count = 1;
  local_120._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_120._M_element_count = 0;
  local_120._M_rehash_policy._M_max_load_factor = 1.0;
  local_120._M_rehash_policy._M_next_resize = 0;
  local_120._M_single_bucket = (__node_base_ptr)0x0;
  __n = 0;
  while (__n < (ulong)((long)(this_01->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this_01->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 6)) {
    other = vector<duckdb::Value,_true>::get<true>(this_01,__n);
    Value::Value(&local_c8,other);
    BoundParameterData::BoundParameterData(&local_88,&local_c8);
    __n = __n + 1;
    ::std::__cxx11::to_string(&local_e8,__n);
    this_00 = ::std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&local_120,&local_e8);
    BoundParameterData::operator=(this_00,&local_88);
    ::std::__cxx11::string::~string((string *)&local_e8);
    BoundParameterData::~BoundParameterData(&local_88);
    Value::~Value(&local_c8);
  }
  PendingQuery(this,(case_insensitive_map_t<BoundParameterData> *)values,SUB81(&local_120,0));
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_120);
  return (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>)
         (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>)
         this;
}

Assistant:

unique_ptr<PendingQueryResult> PreparedStatement::PendingQuery(vector<Value> &values, bool allow_stream_result) {
	case_insensitive_map_t<BoundParameterData> named_values;
	for (idx_t i = 0; i < values.size(); i++) {
		auto &val = values[i];
		named_values[std::to_string(i + 1)] = BoundParameterData(val);
	}
	return PendingQuery(named_values, allow_stream_result);
}